

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
* __thiscall
google::
sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
::equal_range<char_const*>
          (pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *__return_storage_ptr__,
          sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
          *this,char **key)

{
  sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar1;
  long lVar2;
  iterator iVar3;
  iterator *piVar4;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar5;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *psVar6;
  pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *ppVar7;
  byte bVar8;
  iterator pos;
  iterator startpos;
  iterator local_b0;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_68;
  
  bVar8 = 0;
  find<char_const*>(&local_b0,this,key);
  local_68.pos.row_begin._M_current =
       *(sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         **)(this + 0x60);
  local_68.pos.row_end._M_current =
       *(sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         **)(this + 0x68);
  local_68.pos.col_current = (nonempty_iterator)0x0;
  local_68.end.col_current = (nonempty_iterator)0x0;
  local_68.ht = (sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                 *)this;
  local_68.pos.row_current._M_current = local_68.pos.row_end._M_current;
  local_68.end.row_begin._M_current = local_68.pos.row_begin._M_current;
  local_68.end.row_end._M_current = local_68.pos.row_end._M_current;
  local_68.end.row_current._M_current = local_68.pos.row_end._M_current;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_68);
  if ((((local_b0.pos.row_begin._M_current == local_68.pos.row_begin._M_current) &&
       (local_b0.pos.row_end._M_current == local_68.pos.row_end._M_current)) &&
      (local_b0.pos.row_current._M_current == local_68.pos.row_current._M_current)) &&
     ((local_b0.pos.row_current._M_current == local_b0.pos.row_end._M_current ||
      (local_b0.pos.col_current == local_68.pos.col_current)))) {
    psVar5 = &local_b0;
    psVar6 = psVar5;
    ppVar7 = __return_storage_ptr__;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      (ppVar7->first).ht = psVar6->ht;
      psVar6 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)((long)psVar6 + (ulong)bVar8 * -0x10 + 8);
      ppVar7 = (pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                *)((long)ppVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    psVar6 = &__return_storage_ptr__->second;
    lVar2 = 9;
  }
  else {
    piVar4 = &local_b0;
    psVar5 = &local_68;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      psVar5->ht = piVar4->ht;
      piVar4 = (iterator *)((long)piVar4 + ((ulong)bVar8 * -2 + 1) * 8);
      psVar5 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)((long)psVar5 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    local_b0.pos.col_current = local_b0.pos.col_current + 1;
    iVar3._M_current = local_b0.pos.row_current._M_current;
    if (local_b0.pos.col_current ==
        (local_b0.pos.row_current._M_current)->group +
        ((local_b0.pos.row_current._M_current)->settings).num_buckets) {
      do {
        iVar3._M_current = local_b0.pos.row_current._M_current + 1;
        if (iVar3._M_current == local_b0.pos.row_end._M_current) break;
        local_b0.pos.col_current = (iVar3._M_current)->group;
        psVar1 = local_b0.pos.row_current._M_current + 1;
        local_b0.pos.row_current._M_current = iVar3._M_current;
      } while ((psVar1->settings).num_buckets == 0);
    }
    local_b0.pos.row_current._M_current = iVar3._M_current;
    sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_deleted(&local_b0);
    psVar5 = &local_68;
    ppVar7 = __return_storage_ptr__;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      (ppVar7->first).ht = psVar5->ht;
      psVar5 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)((long)psVar5 + ((ulong)bVar8 * -2 + 1) * 8);
      ppVar7 = (pair<google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                *)((long)ppVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    lVar2 = 9;
    psVar5 = &local_b0;
    psVar6 = &__return_storage_ptr__->second;
  }
  for (; lVar2 != 0; lVar2 = lVar2 + -1) {
    psVar6->ht = psVar5->ht;
    psVar5 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar5 + (ulong)bVar8 * -0x10 + 8);
    psVar6 = (sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar6 + (ulong)bVar8 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const K& key) {
    iterator pos = find(key);  // either an iterator or end
    if (pos == end()) {
      return std::pair<iterator, iterator>(pos, pos);
    } else {
      const iterator startpos = pos++;
      return std::pair<iterator, iterator>(startpos, pos);
    }
  }